

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O1

BOOL __thiscall
Js::SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_false>::SetWritable
          (SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_false> *this,
          DynamicObject *instance,PropertyId propertyId,BOOL value)

{
  JavascriptLibrary *pJVar1;
  ScriptContext *scriptContext;
  code *pcVar2;
  PropertyRecord *this_00;
  bool bVar3;
  BOOL BVar4;
  int iVar5;
  PropertyId propertyId_00;
  undefined4 *puVar6;
  DynamicTypeHandler *pDVar7;
  SimpleDictionaryPropertyDescriptor<int> *local_50;
  SimpleDictionaryPropertyDescriptor<int> *descriptor;
  PropertyRecord *propertyRecord;
  int i;
  
  if (propertyId == -1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x7cd,"(propertyId != Constants::NoProperty)",
                                "propertyId != Constants::NoProperty");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  descriptor = (SimpleDictionaryPropertyDescriptor<int> *)
               ScriptContext::GetPropertyName
                         ((((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)
                          ->super_JavascriptLibraryBase).scriptContext.ptr,propertyId);
  bVar3 = JsUtil::
          BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>
          ::TryGetReference<Js::PropertyRecord_const*>
                    ((BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>
                      *)(this->propertyMap).ptr,(PropertyRecord **)&descriptor,&local_50,
                     (int *)&propertyRecord);
  if (bVar3) {
    iVar5 = 1;
    if ((local_50->Attributes & 0x10) == 0) {
      _i = (instance->super_RecyclableObject).type.ptr;
      if (value == 0) {
        BVar4 = ClearAttribute(this,instance,local_50,'\x04');
        if (BVar4 != 0) {
          DynamicObject::ChangeTypeIf(instance,_i);
          pDVar7 = DynamicTypeHandler::GetCurrentTypeHandler(instance);
          pJVar1 = (((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr;
          _i = (Type *)&pJVar1->typesWithOnlyWritablePropertyProtoChain;
          Memory::Recycler::WBSetBit((char *)&propertyRecord);
          propertyRecord = (PropertyRecord *)_i;
          Memory::RecyclerWriteBarrierManager::WriteBarrier(&propertyRecord);
          this_00 = propertyRecord;
          scriptContext = (pJVar1->super_JavascriptLibraryBase).scriptContext.ptr;
          DynamicTypeHandler::SetHasOnlyWritableDataProperties(pDVar7,false);
          if ((pDVar7->flags & 0x20) != 0) {
            propertyId_00 = DynamicTypeHandler::TMapKey_GetPropertyId(scriptContext,propertyId);
            ScriptContext::InvalidateStoreFieldCaches(scriptContext,propertyId_00);
            PrototypeChainCache<Js::OnlyWritablePropertyCache>::Clear
                      ((PrototypeChainCache<Js::OnlyWritablePropertyCache> *)this_00);
          }
        }
      }
      else {
        BVar4 = SetAttribute(this,instance,local_50,'\x04');
        if (BVar4 != 0) {
          DynamicObject::ChangeTypeIf(instance,_i);
        }
      }
    }
  }
  else {
    bVar3 = DynamicObject::HasObjectArray(instance);
    iVar5 = 1;
    if ((bVar3) && (*(char *)(descriptor + 2) == '\x01')) {
      pDVar7 = ConvertToTypeWithItemAttributes(this,instance);
      iVar5 = (*pDVar7->_vptr_DynamicTypeHandler[0x2a])
                        (pDVar7,instance,(ulong)(uint)propertyId,(ulong)(uint)value);
    }
  }
  return iVar5;
}

Assistant:

BOOL SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::SetWritable(DynamicObject* instance, PropertyId propertyId, BOOL value)
    {
        SimpleDictionaryPropertyDescriptor<TPropertyIndex>* descriptor;
        Assert(propertyId != Constants::NoProperty);
        PropertyRecord const* propertyRecord = instance->GetScriptContext()->GetPropertyName(propertyId);
        if (!propertyMap->TryGetReference(propertyRecord, &descriptor))
        {
            // Upgrade type handler if set objectArray item attribute.
            // Only check numeric propertyId if objectArray available.
            if (instance->HasObjectArray() && propertyRecord->IsNumeric())
            {
                return SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::ConvertToTypeWithItemAttributes(instance)
                    ->SetWritable(instance, propertyId, value);
            }
            return true;
        }

        if (descriptor->Attributes & PropertyLetConstGlobal)
        {
            return true;
        }

        const Type* oldType = instance->GetType();
        if (value)
        {
            if (SetAttribute(instance, descriptor, PropertyWritable))
            {
                instance->ChangeTypeIf(oldType); // Ensure type change to invalidate caches
            }
        }
        else
        {
            if (ClearAttribute(instance, descriptor, PropertyWritable))
            {
                instance->ChangeTypeIf(oldType); // Ensure type change to invalidate caches

                // Clearing the attribute may have changed the type handler, so make sure
                // we access the current one.
                DynamicTypeHandler *const typeHandler = GetCurrentTypeHandler(instance);
                JavascriptLibrary * library = instance->GetLibrary();
                library->GetTypesWithOnlyWritablePropertyProtoChainCache()->ProcessProperty(typeHandler, PropertyNone, propertyId, library->GetScriptContext());
            }
        }
        return true;
    }